

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

string * __thiscall
pbrt::TextureSceneEntity::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TextureSceneEntity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ TextureSeneEntity name: %s parameters: %s loc: %s renderFromObject: %s texName: %s ]"
             ,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_TransformedSceneEntity).super_SceneEntity.parameters,
             (ParameterDictionary *)&(this->super_TransformedSceneEntity).super_SceneEntity.loc,
             (FileLoc *)&(this->super_TransformedSceneEntity).renderFromObject,
             (AnimatedTransform *)&this->texName,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TextureSeneEntity name: %s parameters: %s loc: %s "
                            "renderFromObject: %s texName: %s ]",
                            name, parameters, loc, renderFromObject, texName);
    }